

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t count_interesting_shapes(void)

{
  int iVar1;
  player_shape *local_18;
  player_shape *s;
  wchar_t count;
  
  s._4_4_ = L'\0';
  for (local_18 = shapes; local_18 != (player_shape *)0x0; local_18 = local_18->next) {
    iVar1 = strcmp(local_18->name,"normal");
    if (iVar1 != 0) {
      s._4_4_ = s._4_4_ + L'\x01';
    }
  }
  return s._4_4_;
}

Assistant:

static int count_interesting_shapes(void)
{
	int count = 0;
	struct player_shape *s;

	for (s = shapes; s; s = s->next) {
		if (! streq(s->name, "normal")) {
			++count;
		}
	}

	return count;
}